

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationYY.hpp
# Opt level: O1

SquareMatrix<std::complex<float>_> __thiscall
qclab::qgates::RotationYY<std::complex<float>_>::matrix(RotationYY<std::complex<float>_> *this)

{
  undefined4 uVar1;
  undefined1 (*pauVar2) [16];
  data_type extraout_RDX;
  long in_RSI;
  uint uVar3;
  SquareMatrix<std::complex<float>_> SVar4;
  long local_28;
  
  uVar1 = *(undefined4 *)(in_RSI + 0x14);
  uVar3 = *(uint *)(in_RSI + 0x18) ^ 0x80000000;
  local_28 = (ulong)*(uint *)(in_RSI + 0x18) << 0x20;
  (this->super_QRotationGate2<std::complex<float>_>).super_QGate2<std::complex<float>_>.
  super_QObject<std::complex<float>_>._vptr_QObject = (_func_int **)0x4;
  pauVar2 = (undefined1 (*) [16])operator_new__(0x80);
  *pauVar2 = (undefined1  [16])0x0;
  pauVar2[1] = (undefined1  [16])0x0;
  pauVar2[2] = (undefined1  [16])0x0;
  pauVar2[3] = (undefined1  [16])0x0;
  pauVar2[4] = (undefined1  [16])0x0;
  pauVar2[5] = (undefined1  [16])0x0;
  pauVar2[6] = (undefined1  [16])0x0;
  pauVar2[7] = (undefined1  [16])0x0;
  *(undefined1 (**) [16])&(this->super_QRotationGate2<std::complex<float>_>).super_QAdjustable =
       pauVar2;
  *(undefined4 *)*pauVar2 = uVar1;
  *(undefined4 *)(*pauVar2 + 4) = 0;
  *(undefined1 (*) [16])(*pauVar2 + 8) = (undefined1  [16])0x0;
  *(long *)(pauVar2[1] + 8) = local_28;
  *(undefined8 *)pauVar2[2] = 0;
  *(undefined4 *)(pauVar2[2] + 8) = uVar1;
  *(undefined4 *)(pauVar2[2] + 0xc) = 0;
  *(undefined4 *)pauVar2[3] = 0x80000000;
  *(uint *)(pauVar2[3] + 4) = uVar3;
  *(undefined1 (*) [16])(pauVar2[3] + 8) = (undefined1  [16])0x0;
  *(undefined4 *)(pauVar2[4] + 8) = 0x80000000;
  *(uint *)(pauVar2[4] + 0xc) = uVar3;
  *(undefined4 *)pauVar2[5] = uVar1;
  *(undefined4 *)(pauVar2[5] + 4) = 0;
  *(undefined8 *)(pauVar2[5] + 8) = 0;
  *(long *)pauVar2[6] = local_28;
  *(undefined1 (*) [16])(pauVar2[6] + 8) = (undefined1  [16])0x0;
  *(undefined4 *)(pauVar2[7] + 8) = uVar1;
  *(undefined4 *)(pauVar2[7] + 0xc) = 0;
  SVar4.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  SVar4.size_ = (size_type_conflict)this;
  return SVar4;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          const T d = this->cos() ;
          const T o = T(0,this->sin()) ;
          return qclab::dense::SquareMatrix< T >( d , 0 , 0 , o ,
                                                  0 , d ,-o , 0 ,
                                                  0 ,-o , d , 0 ,
                                                  o , 0 , 0 , d ) ;
        }